

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  string *__lhs;
  char cVar1;
  char cVar2;
  cmCommand *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  string message;
  string sdestdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  
  __lhs = &(this->super_cmFileCopier).Destination;
  if (((this->super_cmFileCopier).Destination._M_string_length < 2) &&
     (bVar5 = std::operator!=(__lhs,"/"), bVar5)) {
    pcVar3 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sdestdir,
               "called with inappropriate arguments. No DESTINATION provided or .",
               (allocator<char> *)&message);
    cmCommand::SetError(pcVar3,&sdestdir);
    std::__cxx11::string::~string((string *)&sdestdir);
    return false;
  }
  sdestdir._M_dataplus._M_p = (pointer)&sdestdir.field_2;
  sdestdir._M_string_length = 0;
  sdestdir.field_2._M_local_buf[0] = '\0';
  bVar5 = cmsys::SystemTools::GetEnv("DESTDIR",&sdestdir);
  if (bVar5 && sdestdir._M_string_length != 0) {
    cmsys::SystemTools::ConvertToUnixSlashes(&sdestdir);
    pcVar4 = (this->super_cmFileCopier).Destination._M_dataplus._M_p;
    cVar1 = *pcVar4;
    bVar5 = true;
    if (2 < (this->super_cmFileCopier).Destination._M_string_length) {
      bVar5 = pcVar4[2] != '/';
    }
    cVar2 = pcVar4[1];
    if (cVar1 != '/') {
      lVar7 = 2;
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        if ((bool)(cVar2 != ':' | bVar5)) {
LAB_002defb9:
          pcVar3 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&message,
                     "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                     ,(allocator<char> *)&local_50);
          cmCommand::SetError(pcVar3,&message);
          goto LAB_002df0fc;
        }
      }
      else if ((bool)(cVar2 != ':' | bVar5 | (byte)(cVar1 + 0xa5U) < 0xe6)) goto LAB_002defb9;
LAB_002defe5:
      std::operator+(&message,&sdestdir,pcVar4 + lVar7);
      std::__cxx11::string::operator=((string *)__lhs,(string *)&message);
      std::__cxx11::string::~string((string *)&message);
      this->DestDirLength = (int)sdestdir._M_string_length;
      goto LAB_002df019;
    }
    if (cVar2 != '/') {
      lVar7 = 0;
      goto LAB_002defe5;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,
               "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
               ,(allocator<char> *)&local_50);
    std::__cxx11::string::append((string *)&message);
    cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&message);
LAB_002df0fc:
    std::__cxx11::string::~string((string *)&message);
  }
  else {
LAB_002df019:
    default_dir_mode = &default_dir_mode_v;
    default_dir_mode_v = 0;
    bVar5 = cmFileCopier::GetDefaultDirectoryPermissions
                      (&this->super_cmFileCopier,&default_dir_mode);
    if (bVar5) {
      bVar5 = true;
      if (*(int *)&(this->super_cmFileCopier).field_0xf4 == 6) goto LAB_002df108;
      bVar6 = cmsys::SystemTools::FileExists(__lhs);
      if ((bVar6) || (bVar6 = cmsys::SystemTools::MakeDirectory(__lhs,default_dir_mode), bVar6)) {
        bVar6 = cmsys::SystemTools::FileIsDirectory(__lhs);
        if (bVar6) goto LAB_002df108;
        std::operator+(&local_50,"INSTALL destination: ",__lhs);
        std::operator+(&message,&local_50," is not a directory.");
        std::__cxx11::string::~string((string *)&local_50);
        cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&message);
      }
      else {
        std::operator+(&local_50,"cannot create directory: ",__lhs);
        std::operator+(&message,&local_50,". Maybe need administrative privileges.");
        std::__cxx11::string::~string((string *)&local_50);
        cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,&message);
      }
      goto LAB_002df0fc;
    }
  }
  bVar5 = false;
LAB_002df108:
  std::__cxx11::string::~string((string *)&sdestdir);
  return bVar5;
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if (destination.size() < 2 && destination != "/") {
    this->FileCommand->SetError("called with inappropriate arguments. "
                                "No DESTINATION provided or .");
    return false;
  }

  std::string sdestdir;
  if (cmSystemTools::GetEnv("DESTDIR", sdestdir) && !sdestdir.empty()) {
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if (destination.size() > 2) {
      ch3 = destination[2];
    }
    int skip = 0;
    if (ch1 != '/') {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
          ch2 == ':') {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if (ch3 != '/') {
          relative = 1;
        }
      } else {
        relative = 1;
      }
      if (relative) {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->FileCommand->SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
      }
    } else {
      if (ch2 == '/') {
        // looks like a network path.
        std::string message =
          "called with network path DESTINATION. This "
          "does not make sense when using DESTDIR. Specify local "
          "absolute path or remove DESTDIR environment variable."
          "\nDESTINATION=\n";
        message += destination;
        this->FileCommand->SetError(message);
        return false;
      }
    }
    destination = sdestdir + (destination.c_str() + skip);
    this->DestDirLength = int(sdestdir.size());
  }

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  if (this->InstallType != cmInstallType_DIRECTORY) {
    if (!cmSystemTools::FileExists(destination)) {
      if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->FileCommand->SetError(errstring);
        return false;
      }
    }
    if (!cmSystemTools::FileIsDirectory(destination)) {
      std::string errstring =
        "INSTALL destination: " + destination + " is not a directory.";
      this->FileCommand->SetError(errstring);
      return false;
    }
  }
  return true;
}